

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter1.cpp
# Opt level: O1

void __thiscall
UIContext::UIContext
          (UIContext *this,GraphicsContext *context,string *window_name,int width,int height)

{
  Detail *this_00;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  this->_vptr_UIContext = (_func_int **)&PTR___cxa_pure_virtual_001d8590;
  this_00 = (Detail *)operator_new(0x50);
  local_58._8_8_ = 0;
  pcStack_40 = std::
               _Function_handler<void_(ApplicationContextBase_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/meshula[P]gusteau/src/chapter1.cpp:523:30)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(ApplicationContextBase_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/meshula[P]gusteau/src/chapter1.cpp:523:30)>
             ::_M_manager;
  local_58._M_unused._M_object = this;
  Detail::Detail(this_00,context,(function<void_(ApplicationContextBase_&)> *)&local_58,window_name,
                 width,height);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  this->m_ = this_00;
  return;
}

Assistant:

UIContext::UIContext(GraphicsContext& context,
    const std::string& window_name, int width, int height)
    : m_(new Detail(context, [this](ApplicationContextBase& ac) { Run(ac); }, window_name, width, height))
{
}